

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O1

QList<QObject_*> * __thiscall
QObject::findChildren<QObject*>
          (QList<QObject_*> *__return_storage_ptr__,QObject *this,QAnyStringView aName,
          FindChildOptions options)

{
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QObject **)0x0;
  (__return_storage_ptr__->d).size = 0;
  qt_qFindChildren_helper
            (this,aName,&staticMetaObject,(QList<void_*> *)__return_storage_ptr__,options);
  return __return_storage_ptr__;
}

Assistant:

QList<T> findChildren(QAnyStringView aName, Qt::FindChildOptions options = Qt::FindChildrenRecursively) const
    {
        typedef typename std::remove_cv<typename std::remove_pointer<T>::type>::type ObjType;
        static_assert(QtPrivate::HasQ_OBJECT_Macro<ObjType>::Value,
                          "No Q_OBJECT in the class passed to QObject::findChildren");
        QList<T> list;
        qt_qFindChildren_helper(this, aName, ObjType::staticMetaObject,
                                reinterpret_cast<QList<void *> *>(&list), options);
        return list;
    }